

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

void model_estimate(double *x,int N,int d,int pmax,int h)

{
  uint uVar1;
  double *oup;
  ulong uVar2;
  uint uVar3;
  undefined4 in_register_0000000c;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint q;
  double *a;
  ulong uVar9;
  uint uVar10;
  int pq;
  uint uVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double local_e0;
  double sos;
  double var;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double *local_a8;
  double *local_a0;
  undefined8 local_98;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  double local_80;
  double local_78;
  double *local_70;
  double local_68;
  double local_60;
  uint local_54;
  undefined8 local_50;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_98 = CONCAT44(in_register_0000000c,pmax);
  local_34 = h;
  oup = (double *)malloc((long)(N - d) << 3);
  if (0 < d) {
    N = diff(x,N,d,oup);
  }
  lVar12 = (long)(int)local_34;
  local_70 = (double *)malloc(lVar12 * 8);
  local_a0 = (double *)malloc((long)N * 8);
  dVar13 = mean(x,N);
  uVar2 = 0;
  uVar9 = 0;
  if (0 < N) {
    uVar9 = (ulong)(uint)N;
  }
  for (; uVar9 != uVar2; uVar2 = uVar2 + 1) {
    oup[uVar2] = x[uVar2] - dVar13;
  }
  local_38 = N;
  ywalg(oup,N,local_34,local_70);
  for (uVar2 = 0; uVar9 != uVar2; uVar2 = uVar2 + 1) {
    local_a0[uVar2] = 0.0;
  }
  uVar2 = 0;
  if (0 < (int)local_34) {
    uVar2 = (ulong)local_34;
  }
  lVar5 = (lVar12 << 0x20) + -0x100000000;
  for (; lVar12 < N; lVar12 = lVar12 + 1) {
    dVar13 = oup[lVar12];
    local_a0[lVar12] = dVar13;
    lVar8 = lVar5;
    for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
      dVar13 = dVar13 - local_70[uVar9] * *(double *)((long)oup + (lVar8 >> 0x1d));
      local_a0[lVar12] = dVar13;
      lVar8 = lVar8 + -0x100000000;
    }
    lVar5 = lVar5 + 0x100000000;
  }
  local_80 = (double)(int)local_38;
  local_8c = (int)local_98 + 1;
  dVar14 = 0.0;
  local_54 = 0;
  dVar13 = 0.0;
  dVar15 = 0.0;
  local_50 = (double)((ulong)local_50._4_4_ << 0x20);
  uVar3 = 0;
  uVar6 = 0;
  uVar10 = 0;
  local_40 = 0;
  local_3c = 0;
  a = local_a0;
  uVar7 = local_38;
  local_a8 = oup;
  for (uVar1 = 0; (int)uVar1 <= (int)local_98; uVar1 = uVar1 + 1) {
    uVar4 = local_54;
    local_44 = uVar1;
    for (q = 0; local_8c != q; q = q + 1) {
      pq = uVar1 + q;
      if (pq != 0) {
        local_78 = (double)CONCAT44(local_78._4_4_,uVar10);
        local_c0 = dVar14;
        local_b8 = dVar15;
        local_b0 = dVar13;
        local_88 = uVar6;
        local_84 = uVar3;
        local_48 = q;
        hrstep2(oup,uVar7,local_34,local_44,q,pq,a,&local_e0,&sos);
        local_60 = log(sos);
        local_68 = (double)pq;
        var = (double)uVar4 / local_80 + local_60;
        local_90 = uVar4;
        dVar13 = log(local_80);
        local_c8 = (dVar13 * local_68) / local_80 + local_60;
        dVar13 = log(local_80);
        dVar13 = log(dVar13);
        dVar15 = ((dVar13 + dVar13) * local_68) / local_80 + local_60;
        uVar7 = 0;
        uVar10 = 1;
        uVar6 = 0;
        local_60 = dVar15;
        dVar13 = var;
        dVar14 = local_c8;
        uVar11 = 0;
        uVar1 = uVar10;
        uVar3 = uVar10;
        if (local_48 != 1 || local_44 != 0) {
          uVar3 = local_84;
          uVar7 = (uint)local_50;
          if (var < local_c0) {
            uVar3 = local_48;
            uVar7 = local_44;
          }
          uVar6 = local_88;
          if (local_c8 < local_b0) {
            uVar6 = local_44;
          }
          if (local_c0 <= var) {
            dVar13 = local_c0;
          }
          uVar10 = local_48;
          if (local_b0 <= local_c8) {
            dVar14 = local_b0;
            uVar10 = local_78._0_4_;
          }
          local_60 = local_b8;
          uVar11 = local_40;
          uVar1 = local_3c;
          if (dVar15 < local_b8) {
            local_60 = dVar15;
            uVar11 = local_44;
            uVar1 = local_48;
          }
        }
        local_68 = (double)CONCAT44(local_68._4_4_,uVar1);
        local_78 = dVar13;
        local_50 = dVar14;
        printf("\n p = %d q = %d AIC = %g SC = %g HQ = %g \n",var);
        dVar13 = local_50;
        local_50 = (double)CONCAT44(local_50._4_4_,uVar7);
        local_3c = local_68._0_4_;
        a = local_a0;
        oup = local_a8;
        dVar14 = local_78;
        dVar15 = local_60;
        uVar7 = local_38;
        uVar1 = local_44;
        uVar4 = local_90;
        q = local_48;
        local_40 = uVar11;
      }
      uVar4 = uVar4 + 2;
    }
    local_54 = local_54 + 2;
  }
  puts("\n");
  printf("AIC Estimate : p = %d q = %d \n",(ulong)local_50 & 0xffffffff,(ulong)uVar3);
  printf("SC Estimate  : p = %d q = %d \n",(ulong)uVar6,(ulong)uVar10);
  printf("HQ Estimate  : p = %d q = %d \n",(ulong)local_40,(ulong)local_3c);
  free(oup);
  free(local_70);
  free(a);
  return;
}

Assistant:

void model_estimate(double *x, int N, int d, int pmax, int h) {
	int m, i, t, pq, j;
	double wmean, sos, var, lvar, aic, sc, hq, aic0, sc0, hq0;
	double *inp, *phim, *a;
	int paic, qaic, psc, qsc, phq, qhq;
	/*
	x - Input Time Series of length N
	d - Number of time the series has to be differenced (d = 0 when there are no trends)
	pmax - Maximum AR and MA order pmax = max(p,q)
	h - Order of AR model to be fitted to obtain residuals
	0 <= pmax <= h
	Typically pmax = 3,4 and h = 8. Increase value of h if you want to fit high order ARMA process
	*/

	inp = (double*)malloc(sizeof(double)* (N - d));

	if (d > 0) {
		N = diff(x, N, d, inp); // No need to demean x
	}

	m = h;

	phim = (double*)malloc(sizeof(double)* m);
	a = (double*)malloc(sizeof(double)* N);

	wmean = mean(x, N);

	for (i = 0; i < N; ++i) {
		inp[i] = x[i] - wmean;
	}

	// Estimate AR(m) coefficients

	ywalg(inp, N, m, phim);

	for (i = 0; i < N; ++i) {
		a[i] = 0.0;
	}

	for (t = m; t < N; ++t) {
		a[t] = inp[t];
		for (i = 0; i < m; ++i) {
			a[t] -= phim[i] * inp[t - i - 1];
		}
	}
	aic0 = sc0 = hq0 = 0.0;
	paic = qaic = psc = qsc = phq = qhq = 0;

	for (i = 0; i <= pmax; ++i) {
		for (j = 0; j <= pmax; ++j) {
			pq = i + j;
			if (pq >= 1) {
				hrstep2(inp, N, m, i, j, pq, a, &sos, &var);
				lvar = log(var);
				aic = lvar + 2 * (double)pq / N;
				sc = lvar + log((double)N) * (double)pq / N;
				hq = lvar + 2 * log(log((double)N)) * (double)pq / N;
				if (i == 0 && j == 1) {
					aic0 = aic;
					sc0 = sc;
					hq0 = hq;
					paic = psc = phq = 0;
					qaic = qsc = qhq = 1;
				}
				else {
					if (aic < aic0) {
						aic0 = aic;
						paic = i;
						qaic = j;
					}
					if (sc < sc0) {
						sc0 = sc;
						psc = i;
						qsc = j;
					}
					if (hq < hq0) {
						hq0 = hq;
						phq = i;
						qhq = j;
					}
				}
				printf("\n p = %d q = %d AIC = %g SC = %g HQ = %g \n", i, j, aic, sc, hq);
			}
		}
	}

	printf("\n\n");
	printf("AIC Estimate : p = %d q = %d \n", paic, qaic);
	printf("SC Estimate  : p = %d q = %d \n", psc, qsc);
	printf("HQ Estimate  : p = %d q = %d \n", phq, qhq);

	free(inp);
	free(phim);
	free(a);
}